

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O2

int flvtag_avcwritenal(flvtag_t *tag,uint8_t *data,size_t size)

{
  uint8_t *puVar1;
  uint uVar2;
  size_t sVar3;
  uint32_t size_00;
  
  if (size != 0) {
    sVar3 = flvtag_size(tag);
    uVar2 = (uint)size;
    size_00 = uVar2 + (int)sVar3 + 4;
    flvtag_reserve(tag,size_00);
    puVar1 = tag->data;
    *(uint *)(puVar1 + sVar3 + 0xb) =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    memcpy(puVar1 + sVar3 + 0xf,data,size);
    flvtag_updatesize(tag,size_00);
  }
  return 1;
}

Assistant:

int flvtag_avcwritenal(flvtag_t* tag, uint8_t* data, size_t size)
{
    if (0 < size) {
        uint32_t flvsize = flvtag_size(tag);
        flvtag_reserve(tag, flvsize + LENGTH_SIZE + size);
        uint8_t* payload = tag->data + FLV_TAG_HEADER_SIZE + flvsize;
        payload[0] = size >> 24; // nalu size
        payload[1] = size >> 16;
        payload[2] = size >> 8;
        payload[3] = size >> 0;
        memcpy(&payload[LENGTH_SIZE], data, size);
        flvtag_updatesize(tag, flvsize + LENGTH_SIZE + size);
    }
    return 1;
}